

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonsugar.hpp
# Opt level: O3

void __thiscall
nonsugar::detail::parse_flag_short<std::__cxx11::string,int,void>::operator()
          (parse_flag_short<std::__cxx11::string,int,void> *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              last,__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *arg_it,
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          arg_last,shared_ptr<int> *value,
          flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,__b_,_int>
          *flg,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *err)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  long *plVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  ulong *puVar5;
  long *plVar6;
  ulong uVar7;
  long *unaff_R15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s;
  shared_ptr<int> v;
  long *local_100;
  ulong local_f8;
  long local_f0;
  undefined8 uStack_e8;
  long *local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  ulong *local_c0;
  long local_b8;
  ulong local_b0;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90;
  undefined7 uStack_8f;
  ulong *local_80;
  long local_78;
  ulong local_70 [2];
  undefined1 local_60 [16];
  long *local_50;
  ulong local_48;
  long local_40 [2];
  
  local_a0 = &local_90;
  local_98 = 0;
  local_90 = 0;
  if (it->_M_current + 1 == last._M_current) {
    pbVar1 = arg_it->_M_current;
    arg_it->_M_current = pbVar1 + 1;
    if (pbVar1 + 1 == arg_last._M_current) {
      local_100 = &local_f0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_100,"argument required: -","");
      plVar2 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_100,local_f8,0,'\x01');
      plVar6 = plVar2 + 2;
      if ((long *)*plVar2 == plVar6) {
        local_d0 = *plVar6;
        lStack_c8 = plVar2[3];
        local_e0 = &local_d0;
      }
      else {
        local_d0 = *plVar6;
        local_e0 = (long *)*plVar2;
      }
      local_d8 = plVar2[1];
      *plVar2 = (long)plVar6;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::operator=((string *)err,(string *)&local_e0);
      if (local_e0 != &local_d0) {
        operator_delete(local_e0,local_d0 + 1);
      }
      if (local_100 != &local_f0) {
        operator_delete(local_100,local_f0 + 1);
      }
      goto LAB_00151496;
    }
    std::__cxx11::string::_M_assign((string *)&local_a0);
  }
  else {
    local_e0 = &local_d0;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)&local_e0);
    std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_e0);
    if (local_e0 != &local_d0) {
      operator_delete(local_e0,local_d0 + 1);
    }
    unaff_R15 = (long *)(last._M_current + -1);
    it->_M_current = (char *)unaff_R15;
  }
  if ((flg->read).super__Function_base._M_manager == (_Manager_type)0x0) {
    uVar4 = std::__throw_bad_function_call();
    if (local_100 != unaff_R15) {
      operator_delete(local_100,local_f0 + 1);
    }
    if (local_a0 != &local_90) {
      operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
    }
    _Unwind_Resume(uVar4);
  }
  (*(flg->read)._M_invoker)
            ((_Any_data *)local_60,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flg->read);
  if ((element_type *)local_60._0_8_ == (element_type *)0x0) {
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"invalid argument: -","");
    plVar2 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_50,local_48,0,'\x01');
    puVar5 = (ulong *)(plVar2 + 2);
    if ((ulong *)*plVar2 == puVar5) {
      local_b0 = *puVar5;
      uStack_a8 = (undefined4)plVar2[3];
      uStack_a4 = *(undefined4 *)((long)plVar2 + 0x1c);
      local_c0 = &local_b0;
    }
    else {
      local_b0 = *puVar5;
      local_c0 = (ulong *)*plVar2;
    }
    local_b8 = plVar2[1];
    *plVar2 = (long)puVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    local_80 = local_70;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80," ","");
    uVar7 = 0xf;
    if (local_c0 != &local_b0) {
      uVar7 = local_b0;
    }
    if (uVar7 < (ulong)(local_78 + local_b8)) {
      uVar7 = 0xf;
      if (local_80 != local_70) {
        uVar7 = local_70[0];
      }
      if (uVar7 < (ulong)(local_78 + local_b8)) goto LAB_00151332;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_c0);
    }
    else {
LAB_00151332:
      puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_80);
    }
    local_100 = &local_f0;
    plVar2 = puVar3 + 2;
    if ((long *)*puVar3 == plVar2) {
      local_f0 = *plVar2;
      uStack_e8 = puVar3[3];
    }
    else {
      local_f0 = *plVar2;
      local_100 = (long *)*puVar3;
    }
    local_f8 = puVar3[1];
    *puVar3 = plVar2;
    puVar3[1] = 0;
    *(char *)plVar2 = '\0';
    plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_a0);
    plVar6 = plVar2 + 2;
    if ((long *)*plVar2 == plVar6) {
      local_d0 = *plVar6;
      lStack_c8 = plVar2[3];
      local_e0 = &local_d0;
    }
    else {
      local_d0 = *plVar6;
      local_e0 = (long *)*plVar2;
    }
    local_d8 = plVar2[1];
    *plVar2 = (long)plVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::operator=((string *)err,(string *)&local_e0);
    if (local_e0 != &local_d0) {
      operator_delete(local_e0,local_d0 + 1);
    }
    if (local_100 != &local_f0) {
      operator_delete(local_100,local_f0 + 1);
    }
    if (local_80 != local_70) {
      operator_delete(local_80,local_70[0] + 1);
    }
    if (local_c0 != &local_b0) {
      operator_delete(local_c0,local_b0 + 1);
    }
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
  }
  else {
    (value->super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)local_60._0_8_;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(value->super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>)._M_refcount,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
  }
LAB_00151496:
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  return;
}

Assistant:

void operator()(
        NameIterator &it, NameIterator last, Iterator &arg_it, Iterator arg_last,
        std::shared_ptr<Value> &value, Flag const &flg, String &err) const
    {
        auto const name = *it;
        String s;
        if (std::next(it) == last) {
            ++arg_it;
            if (arg_it == arg_last) {
                err = widen<String>("argument required: -") + name;
                return;
            }
            s = *arg_it;
        } else {
            s = String(std::next(it), last);
            it = std::prev(last);
        }
        auto const v = flg.read(s);
        if (!v) {
            err = widen<String>("invalid argument: -") + name + widen<String>(" ") + s;
            return;
        }
        value = v;
    }